

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void __thiscall absl::lts_20250127::log_internal::LogMessage::~LogMessage(LogMessage *this)

{
  int iVar1;
  LogMessageData *__ptr;
  int *piVar2;
  
  Flush(this);
  __ptr = (this->data_)._M_t.
          super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          ._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl;
  if (__ptr != (LogMessageData *)0x0) {
    std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>::operator()
              ((default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData> *)
               &this->data_,__ptr);
  }
  (this->data_)._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (LogMessageData *)0x0;
  iVar1 = (this->errno_saver_).saved_errno_;
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return;
}

Assistant:

LogMessage::~LogMessage() {
#ifdef ABSL_MIN_LOG_LEVEL
  if (data_->entry.log_severity() <
          static_cast<absl::LogSeverity>(ABSL_MIN_LOG_LEVEL) &&
      data_->entry.log_severity() < absl::LogSeverity::kFatal) {
    return;
  }
#endif
  Flush();
}